

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_interpolation_error
          (REF_DBL *metric,REF_DBL *hess,REF_GRID ref_grid,REF_DBL *interpolation_error)

{
  REF_NODE ref_node_00;
  uint uVar1;
  double dVar2;
  double local_118;
  double local_108;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL constant;
  REF_DBL sqrt_det;
  REF_DBL det;
  REF_DBL m1neghalf [6];
  REF_DBL m1half [6];
  REF_DBL error [6];
  int local_3c;
  REF_INT node;
  REF_NODE ref_node;
  REF_DBL *interpolation_error_local;
  REF_GRID ref_grid_local;
  REF_DBL *hess_local;
  REF_DBL *metric_local;
  
  ref_node_00 = ref_grid->node;
  _ref_private_macro_code_rss_1 = 0.1;
  if (ref_grid->twod != 0) {
    _ref_private_macro_code_rss_1 = 0.125;
  }
  local_3c = 0;
  do {
    if (ref_node_00->max <= local_3c) {
      metric_local._4_4_ = ref_node_ghost_dbl(ref_node_00,interpolation_error,1);
      if (metric_local._4_4_ == 0) {
        metric_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x402,"ref_metric_interpolation_error",(ulong)metric_local._4_4_,"update ghosts");
      }
      return metric_local._4_4_;
    }
    if ((((-1 < local_3c) && (local_3c < ref_node_00->max)) && (-1 < ref_node_00->global[local_3c]))
       && (ref_node_00->ref_mpi->id == ref_node_00->part[local_3c])) {
      uVar1 = ref_matrix_sqrt_m(metric + local_3c * 6,m1neghalf + 5,&det);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x3ed,"ref_metric_interpolation_error",(ulong)uVar1,"m^-1/2");
        return uVar1;
      }
      uVar1 = ref_matrix_mult_m0m1m0(&det,hess + local_3c * 6,m1half + 5);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x3ef,"ref_metric_interpolation_error",(ulong)uVar1,"error=m1half*hess*m1half");
        return uVar1;
      }
      uVar1 = ref_matrix_det_m(metric + local_3c * 6,&sqrt_det);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x3f0,"ref_metric_interpolation_error",(ulong)uVar1,"det");
        return uVar1;
      }
      if (ref_grid->twod == 0) {
        interpolation_error[local_3c] =
             _ref_private_macro_code_rss_1 * (m1half[5] + error[2] + error[4]);
      }
      else {
        interpolation_error[local_3c] = _ref_private_macro_code_rss_1 * (m1half[5] + error[2]);
      }
      if (sqrt_det < 0.0) {
        interpolation_error[local_3c] = 0.0;
      }
      else {
        dVar2 = sqrt(sqrt_det);
        if (dVar2 * 1e+20 <= 0.0) {
          local_108 = -(dVar2 * 1e+20);
        }
        else {
          local_108 = dVar2 * 1e+20;
        }
        if (interpolation_error[local_3c] <= 0.0) {
          local_118 = -interpolation_error[local_3c];
        }
        else {
          local_118 = interpolation_error[local_3c];
        }
        if (local_108 <= local_118) {
          interpolation_error[local_3c] = 0.0;
        }
        else {
          interpolation_error[local_3c] = interpolation_error[local_3c] / dVar2;
        }
      }
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_interpolation_error(
    REF_DBL *metric, REF_DBL *hess, REF_GRID ref_grid,
    REF_DBL *interpolation_error) {
  /* Corollary 3.4 CONTINUOUS MESH FRAMEWORK PART I DOI:10.1137/090754078 */
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL error[6], m1half[6], m1neghalf[6], det, sqrt_det;
  REF_DBL constant = 1.0 / 10.0;
  if (ref_grid_twod(ref_grid)) {
    constant = 1.0 / 8.0;
  }
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_sqrt_m(&(metric[6 * node]), m1half, m1neghalf), "m^-1/2");
      RSS(ref_matrix_mult_m0m1m0(m1neghalf, &(hess[6 * node]), error),
          "error=m1half*hess*m1half");
      RSS(ref_matrix_det_m(&(metric[6 * node]), &det), "det");
      if (ref_grid_twod(ref_grid)) {
        interpolation_error[node] = constant * (error[0] + error[3]);
      } else {
        interpolation_error[node] = constant * (error[0] + error[3] + error[5]);
      }
      if (det >= 0.0) {
        sqrt_det = sqrt(det);
        if (ref_math_divisible(interpolation_error[node], sqrt_det)) {
          interpolation_error[node] /= sqrt_det;
        } else {
          interpolation_error[node] = 0.0;
        }
      } else {
        interpolation_error[node] = 0.0;
      }
    }
  }
  RSS(ref_node_ghost_dbl(ref_node, interpolation_error, 1), "update ghosts");

  return REF_SUCCESS;
}